

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O2

vector3df __thiscall irr::scene::SViewFrustum::getNearRightDown(SViewFrustum *this)

{
  vector3df vVar1;
  vector3d<float> local_18;
  
  local_18.X = 0.0;
  local_18.Y = 0.0;
  local_18.Z = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes
            (this->planes + 1,this->planes + 4,this->planes + 3,&local_18);
  vVar1.Z = local_18.Z;
  vVar1.X = local_18.X;
  vVar1.Y = local_18.Y;
  return vVar1;
}

Assistant:

inline core::vector3df SViewFrustum::getNearRightDown() const
{
	core::vector3df p;
	planes[scene::SViewFrustum::VF_NEAR_PLANE].getIntersectionWithPlanes(
			planes[scene::SViewFrustum::VF_BOTTOM_PLANE],
			planes[scene::SViewFrustum::VF_RIGHT_PLANE], p);

	return p;
}